

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::InstanceIntersectorK<8>_>,_false>
     ::occludedCoherent(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  float *pfVar1;
  long lVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  int aiVar5 [8];
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 aVar26;
  undefined4 uVar27;
  vbool<8> *pvVar28;
  uint uVar29;
  ulong *puVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong *puVar38;
  NodeRef nodeRef;
  ulong uVar39;
  Primitive *prim;
  bool bVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  vint4 bi;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar63 [16];
  vint4 ai;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [16];
  Precalculations pre;
  vbool<8> valid0;
  StackItemMaskT<embree::NodeRefPtr<4>_> stack [244];
  Precalculations local_1301;
  undefined1 local_1300 [16];
  RayK<8> *local_12e8;
  AccelData *local_12e0;
  vbool<8> *local_12d8;
  ulong local_12d0;
  RayK<8> *local_12c8;
  RayQueryContext *local_12c0;
  vbool<8> *local_12b8;
  ulong local_12b0;
  ulong local_12a8;
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [16];
  uint uStack_1230;
  uint uStack_122c;
  uint uStack_1228;
  uint uStack_1224;
  undefined1 local_1210 [16];
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [16];
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [16];
  undefined1 local_11b0 [8];
  float fStack_11a8;
  float fStack_11a4;
  undefined1 local_11a0 [8];
  float fStack_1198;
  float fStack_1194;
  undefined1 local_1190 [8];
  float fStack_1188;
  float fStack_1184;
  undefined1 local_1180 [16];
  undefined1 local_1170 [8];
  float fStack_1168;
  float fStack_1164;
  undefined1 local_1160 [16];
  undefined1 local_1150 [8];
  float fStack_1148;
  float fStack_1144;
  undefined1 local_1140 [16];
  undefined1 local_1130 [8];
  float fStack_1128;
  float fStack_1124;
  undefined1 local_1120 [32];
  float local_1100;
  float fStack_10fc;
  float fStack_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float fStack_10e8;
  float fStack_10e4;
  float local_10e0;
  float fStack_10dc;
  float fStack_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  float fStack_10c4;
  float local_10c0;
  float fStack_10bc;
  float fStack_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float fStack_10a8;
  float fStack_10a4;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_fc0;
  ulong local_fa0 [494];
  undefined1 auVar62 [28];
  undefined1 auVar67 [28];
  undefined1 auVar83 [32];
  
  auVar41 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  auVar50 = vpcmpeqd_avx(auVar41,*(undefined1 (*) [16])(valid_i->field_0).field_1.vl);
  auVar58 = vpcmpeqd_avx(auVar41,*(undefined1 (*) [16])((long)&valid_i->field_0 + 0x10));
  auVar50 = vpackssdw_avx(auVar50,auVar58);
  if ((((((((((((((((auVar50 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar50 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar50 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar50 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar50 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar50 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar50 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar50 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar50 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar50 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar50 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar50 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar50 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar50 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar50 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar50[0xf]) {
    return;
  }
  auVar58 = vpacksswb_avx(auVar50,auVar50);
  local_12e0 = This->ptr;
  local_1060 = *(undefined8 *)ray;
  uStack_1058 = *(undefined8 *)(ray + 8);
  uStack_1050 = *(undefined8 *)(ray + 0x10);
  uStack_1048 = *(undefined8 *)(ray + 0x18);
  local_1080 = *(undefined8 *)(ray + 0x20);
  uStack_1078 = *(undefined8 *)(ray + 0x28);
  uStack_1070 = *(undefined8 *)(ray + 0x30);
  uStack_1068 = *(undefined8 *)(ray + 0x38);
  auVar47 = *(undefined1 (*) [32])(ray + 0x80);
  auVar70._8_4_ = 0x7fffffff;
  auVar70._0_8_ = 0x7fffffff7fffffff;
  auVar70._12_4_ = 0x7fffffff;
  auVar70._16_4_ = 0x7fffffff;
  auVar70._20_4_ = 0x7fffffff;
  auVar70._24_4_ = 0x7fffffff;
  auVar70._28_4_ = 0x7fffffff;
  auVar3 = vandps_avx(auVar47,auVar70);
  auVar75._8_4_ = 0x219392ef;
  auVar75._0_8_ = 0x219392ef219392ef;
  auVar75._12_4_ = 0x219392ef;
  auVar75._16_4_ = 0x219392ef;
  auVar75._20_4_ = 0x219392ef;
  auVar75._24_4_ = 0x219392ef;
  auVar75._28_4_ = 0x219392ef;
  auVar3 = vcmpps_avx(auVar3,auVar75,1);
  auVar71 = vblendvps_avx(auVar47,auVar75,auVar3);
  auVar3 = *(undefined1 (*) [32])(ray + 0xa0);
  auVar4 = vandps_avx(auVar3,auVar70);
  auVar4 = vcmpps_avx(auVar4,auVar75,1);
  auVar46 = vblendvps_avx(auVar3,auVar75,auVar4);
  auVar4 = *(undefined1 (*) [32])(ray + 0xc0);
  auVar45 = vandps_avx(auVar4,auVar70);
  auVar45 = vcmpps_avx(auVar45,auVar75,1);
  auVar45 = vblendvps_avx(auVar4,auVar75,auVar45);
  local_10a0 = *(undefined8 *)(ray + 0x40);
  uStack_1098 = *(undefined8 *)(ray + 0x48);
  uStack_1090 = *(undefined8 *)(ray + 0x50);
  uStack_1088 = *(undefined8 *)(ray + 0x58);
  auVar13 = vrcpps_avx(auVar71);
  fVar6 = auVar13._0_4_;
  fVar7 = auVar13._4_4_;
  auVar14._4_4_ = auVar71._4_4_ * fVar7;
  auVar14._0_4_ = auVar71._0_4_ * fVar6;
  fVar8 = auVar13._8_4_;
  auVar14._8_4_ = auVar71._8_4_ * fVar8;
  fVar9 = auVar13._12_4_;
  auVar14._12_4_ = auVar71._12_4_ * fVar9;
  fVar10 = auVar13._16_4_;
  auVar14._16_4_ = auVar71._16_4_ * fVar10;
  fVar11 = auVar13._20_4_;
  auVar14._20_4_ = auVar71._20_4_ * fVar11;
  fVar12 = auVar13._24_4_;
  auVar14._24_4_ = auVar71._24_4_ * fVar12;
  auVar14._28_4_ = auVar71._28_4_;
  auVar80._8_4_ = 0x3f800000;
  auVar80._0_8_ = 0x3f8000003f800000;
  auVar80._12_4_ = 0x3f800000;
  auVar80._16_4_ = 0x3f800000;
  auVar80._20_4_ = 0x3f800000;
  auVar80._24_4_ = 0x3f800000;
  auVar80._28_4_ = 0x3f800000;
  auVar14 = vsubps_avx(auVar80,auVar14);
  auVar71 = vrcpps_avx(auVar46);
  fStack_10a4 = auVar13._28_4_ + auVar14._28_4_;
  local_10c0 = fVar6 + fVar6 * auVar14._0_4_;
  fStack_10bc = fVar7 + fVar7 * auVar14._4_4_;
  fStack_10b8 = fVar8 + fVar8 * auVar14._8_4_;
  fStack_10b4 = fVar9 + fVar9 * auVar14._12_4_;
  fStack_10b0 = fVar10 + fVar10 * auVar14._16_4_;
  fStack_10ac = fVar11 + fVar11 * auVar14._20_4_;
  fStack_10a8 = fVar12 + fVar12 * auVar14._24_4_;
  fVar6 = auVar71._0_4_;
  fVar7 = auVar71._4_4_;
  auVar13._4_4_ = auVar46._4_4_ * fVar7;
  auVar13._0_4_ = auVar46._0_4_ * fVar6;
  fVar8 = auVar71._8_4_;
  auVar13._8_4_ = auVar46._8_4_ * fVar8;
  fVar9 = auVar71._12_4_;
  auVar13._12_4_ = auVar46._12_4_ * fVar9;
  fVar10 = auVar71._16_4_;
  auVar13._16_4_ = auVar46._16_4_ * fVar10;
  fVar11 = auVar71._20_4_;
  auVar13._20_4_ = auVar46._20_4_ * fVar11;
  fVar12 = auVar71._24_4_;
  auVar13._24_4_ = auVar46._24_4_ * fVar12;
  auVar13._28_4_ = fStack_10a4;
  auVar13 = vsubps_avx(auVar80,auVar13);
  auVar46 = vrcpps_avx(auVar45);
  local_10e0 = fVar6 + fVar6 * auVar13._0_4_;
  fStack_10dc = fVar7 + fVar7 * auVar13._4_4_;
  fStack_10d8 = fVar8 + fVar8 * auVar13._8_4_;
  fStack_10d4 = fVar9 + fVar9 * auVar13._12_4_;
  fStack_10d0 = fVar10 + fVar10 * auVar13._16_4_;
  fStack_10cc = fVar11 + fVar11 * auVar13._20_4_;
  fStack_10c8 = fVar12 + fVar12 * auVar13._24_4_;
  fStack_10c4 = auVar71._28_4_ + auVar13._28_4_;
  fVar6 = auVar46._0_4_;
  fVar7 = auVar46._4_4_;
  auVar71._4_4_ = auVar45._4_4_ * fVar7;
  auVar71._0_4_ = auVar45._0_4_ * fVar6;
  fVar8 = auVar46._8_4_;
  auVar71._8_4_ = auVar45._8_4_ * fVar8;
  fVar9 = auVar46._12_4_;
  auVar71._12_4_ = auVar45._12_4_ * fVar9;
  fVar10 = auVar46._16_4_;
  auVar71._16_4_ = auVar45._16_4_ * fVar10;
  fVar11 = auVar46._20_4_;
  auVar71._20_4_ = auVar45._20_4_ * fVar11;
  fVar12 = auVar46._24_4_;
  auVar71._24_4_ = auVar45._24_4_ * fVar12;
  auVar71._28_4_ = auVar45._28_4_;
  auVar45 = vsubps_avx(auVar80,auVar71);
  local_1100 = fVar6 + fVar6 * auVar45._0_4_;
  fStack_10fc = fVar7 + fVar7 * auVar45._4_4_;
  fStack_10f8 = fVar8 + fVar8 * auVar45._8_4_;
  fStack_10f4 = fVar9 + fVar9 * auVar45._12_4_;
  fStack_10f0 = fVar10 + fVar10 * auVar45._16_4_;
  fStack_10ec = fVar11 + fVar11 * auVar45._20_4_;
  fStack_10e8 = fVar12 + fVar12 * auVar45._24_4_;
  fStack_10e4 = auVar46._28_4_ + auVar45._28_4_;
  auVar45 = ZEXT1232(ZEXT412(0)) << 0x20;
  local_1000 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar45);
  local_12e8 = ray + 0x100;
  local_1020 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar45);
  auVar59 = vpmovsxwd_avx(auVar50);
  local_1210 = vpunpckhwd_avx(auVar50,auVar50);
  auVar50 = auVar50 ^ auVar41;
  auVar41 = vpmovsxwd_avx(auVar50);
  auVar50 = vpunpckhwd_avx(auVar50,auVar50);
  local_12a0._16_16_ = auVar50;
  local_12a0._0_16_ = auVar41;
  auVar71 = ZEXT1232(ZEXT412(0)) << 0x20;
  auVar47 = vcmpps_avx(auVar47,auVar71,1);
  auVar45._8_4_ = 1;
  auVar45._0_8_ = 0x100000001;
  auVar45._12_4_ = 1;
  auVar45._16_4_ = 1;
  auVar45._20_4_ = 1;
  auVar45._24_4_ = 1;
  auVar45._28_4_ = 1;
  auVar47 = vandps_avx(auVar47,auVar45);
  auVar3 = vcmpps_avx(auVar3,auVar71,1);
  auVar52._8_4_ = 2;
  auVar52._0_8_ = 0x200000002;
  auVar52._12_4_ = 2;
  auVar52._16_4_ = 2;
  auVar52._20_4_ = 2;
  auVar52._24_4_ = 2;
  auVar52._28_4_ = 2;
  auVar3 = vandps_avx(auVar3,auVar52);
  local_1040 = ZEXT1632(auVar59);
  auVar53._16_16_ = local_1210;
  auVar53._0_16_ = auVar59;
  auVar3 = vorps_avx(auVar3,auVar47);
  auVar46._8_4_ = 4;
  auVar46._0_8_ = 0x400000004;
  auVar46._12_4_ = 4;
  auVar46._16_4_ = 4;
  auVar46._20_4_ = 4;
  auVar46._24_4_ = 4;
  auVar46._28_4_ = 4;
  auVar47 = vcmpps_avx(auVar4,auVar71,1);
  auVar47 = vandps_avx(auVar47,auVar46);
  auVar3 = vorps_avx(auVar3,auVar47);
  auVar47 = vcmpps_avx(auVar47,auVar47,0xf);
  local_1260 = vblendvps_avx(auVar47,auVar3,auVar53);
  pvVar28 = (vbool<8> *)
            (ulong)(byte)(SUB161(auVar58 >> 7,0) & 1 | (SUB161(auVar58 >> 0xf,0) & 1) << 1 |
                          (SUB161(auVar58 >> 0x17,0) & 1) << 2 |
                          (SUB161(auVar58 >> 0x1f,0) & 1) << 3 |
                          (SUB161(auVar58 >> 0x27,0) & 1) << 4 |
                          (SUB161(auVar58 >> 0x2f,0) & 1) << 5 |
                          (SUB161(auVar58 >> 0x37,0) & 1) << 6 | SUB161(auVar58 >> 0x3f,0) << 7);
  local_12c8 = ray;
  local_12c0 = context;
LAB_003bcc1f:
  lVar2 = 0;
  if (pvVar28 != (vbool<8> *)0x0) {
    for (; ((ulong)pvVar28 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
    }
  }
  uVar27 = *(undefined4 *)(local_1260 + lVar2 * 4);
  auVar41._4_4_ = uVar27;
  auVar41._0_4_ = uVar27;
  auVar41._8_4_ = uVar27;
  auVar41._12_4_ = uVar27;
  auVar50 = vpcmpeqd_avx(auVar41,local_1260._0_16_);
  auVar41 = vpcmpeqd_avx(auVar41,local_1260._16_16_);
  auVar50 = vpackssdw_avx(auVar50,auVar41);
  auVar65 = vpmovsxwd_avx(auVar50);
  auVar51 = vpunpckhwd_avx(auVar50,auVar50);
  local_1120._16_16_ = auVar51;
  local_1120._0_16_ = auVar65;
  auVar50 = vpacksswb_avx(auVar50,auVar50);
  local_fa0[1] = (ulong)(byte)(SUB161(auVar50 >> 7,0) & 1 | (SUB161(auVar50 >> 0xf,0) & 1) << 1 |
                               (SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                               (SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                               (SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                               (SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                               (SUB161(auVar50 >> 0x37,0) & 1) << 6 | SUB161(auVar50 >> 0x3f,0) << 7
                              );
  local_fa0[0] = *(ulong *)&local_12e0[1].bounds.bounds0.lower.field_0;
  auVar82._8_4_ = 0xff800000;
  auVar82._0_8_ = 0xff800000ff800000;
  auVar82._12_4_ = 0xff800000;
  auVar83._16_4_ = 0xff800000;
  auVar83._0_16_ = auVar82;
  auVar83._20_4_ = 0xff800000;
  auVar83._24_4_ = 0xff800000;
  auVar83._28_4_ = 0xff800000;
  local_1280 = vblendvps_avx(auVar83,local_1020,local_1120);
  auVar24._8_8_ = uStack_1058;
  auVar24._0_8_ = local_1060;
  auVar24._16_8_ = uStack_1050;
  auVar24._24_8_ = uStack_1048;
  auVar81._8_4_ = 0x7f800000;
  auVar81._0_8_ = 0x7f8000007f800000;
  auVar81._12_4_ = 0x7f800000;
  auVar81._16_4_ = 0x7f800000;
  auVar81._20_4_ = 0x7f800000;
  auVar81._24_4_ = 0x7f800000;
  auVar81._28_4_ = 0x7f800000;
  auVar47 = vblendvps_avx(auVar81,auVar24,local_1120);
  auVar3 = vshufps_avx(auVar47,auVar47,0xb1);
  auVar47 = vminps_avx(auVar47,auVar3);
  auVar3 = vshufpd_avx(auVar47,auVar47,5);
  auVar47 = vminps_avx(auVar47,auVar3);
  auVar50 = vminps_avx(auVar47._0_16_,auVar47._16_16_);
  auVar22._8_8_ = uStack_1078;
  auVar22._0_8_ = local_1080;
  auVar22._16_8_ = uStack_1070;
  auVar22._24_8_ = uStack_1068;
  auVar47 = vblendvps_avx(auVar81,auVar22,local_1120);
  auVar3 = vshufps_avx(auVar47,auVar47,0xb1);
  auVar47 = vminps_avx(auVar47,auVar3);
  auVar3 = vshufpd_avx(auVar47,auVar47,5);
  auVar47 = vminps_avx(auVar47,auVar3);
  auVar41 = vminps_avx(auVar47._0_16_,auVar47._16_16_);
  auVar20._8_8_ = uStack_1098;
  auVar20._0_8_ = local_10a0;
  auVar20._16_8_ = uStack_1090;
  auVar20._24_8_ = uStack_1088;
  auVar47 = vblendvps_avx(auVar81,auVar20,local_1120);
  auVar41 = vunpcklps_avx(auVar50,auVar41);
  auVar3 = vshufps_avx(auVar47,auVar47,0xb1);
  auVar47 = vminps_avx(auVar47,auVar3);
  auVar3 = vshufpd_avx(auVar47,auVar47,5);
  auVar47 = vminps_avx(auVar47,auVar3);
  auVar50 = vminps_avx(auVar47._0_16_,auVar47._16_16_);
  auVar58 = vinsertps_avx(auVar41,auVar50,0x28);
  auVar47 = vblendvps_avx(auVar83,auVar24,local_1120);
  auVar3 = vshufps_avx(auVar47,auVar47,0xb1);
  auVar47 = vmaxps_avx(auVar47,auVar3);
  auVar3 = vshufpd_avx(auVar47,auVar47,5);
  auVar47 = vmaxps_avx(auVar47,auVar3);
  auVar50 = vmaxps_avx(auVar47._0_16_,auVar47._16_16_);
  auVar47 = vblendvps_avx(auVar83,auVar22,local_1120);
  auVar3 = vshufps_avx(auVar47,auVar47,0xb1);
  auVar47 = vmaxps_avx(auVar47,auVar3);
  auVar3 = vshufpd_avx(auVar47,auVar47,5);
  auVar47 = vmaxps_avx(auVar47,auVar3);
  auVar41 = vmaxps_avx(auVar47._0_16_,auVar47._16_16_);
  auVar41 = vunpcklps_avx(auVar50,auVar41);
  auVar47 = vblendvps_avx(auVar83,auVar20,local_1120);
  auVar3 = vshufps_avx(auVar47,auVar47,0xb1);
  auVar47 = vmaxps_avx(auVar47,auVar3);
  auVar3 = vshufpd_avx(auVar47,auVar47,5);
  auVar47 = vmaxps_avx(auVar47,auVar3);
  auVar50 = vmaxps_avx(auVar47._0_16_,auVar47._16_16_);
  auVar60 = vinsertps_avx(auVar41,auVar50,0x28);
  auVar19._4_4_ = fStack_10bc;
  auVar19._0_4_ = local_10c0;
  auVar19._8_4_ = fStack_10b8;
  auVar19._12_4_ = fStack_10b4;
  auVar19._16_4_ = fStack_10b0;
  auVar19._20_4_ = fStack_10ac;
  auVar19._24_4_ = fStack_10a8;
  auVar19._28_4_ = fStack_10a4;
  auVar47 = vblendvps_avx(auVar81,auVar19,local_1120);
  auVar3 = vshufps_avx(auVar47,auVar47,0xb1);
  auVar47 = vminps_avx(auVar47,auVar3);
  auVar3 = vshufpd_avx(auVar47,auVar47,5);
  auVar47 = vminps_avx(auVar47,auVar3);
  auVar50 = vminps_avx(auVar47._0_16_,auVar47._16_16_);
  auVar18._4_4_ = fStack_10dc;
  auVar18._0_4_ = local_10e0;
  auVar18._8_4_ = fStack_10d8;
  auVar18._12_4_ = fStack_10d4;
  auVar18._16_4_ = fStack_10d0;
  auVar18._20_4_ = fStack_10cc;
  auVar18._24_4_ = fStack_10c8;
  auVar18._28_4_ = fStack_10c4;
  auVar47 = vblendvps_avx(auVar81,auVar18,local_1120);
  auVar3 = vshufps_avx(auVar47,auVar47,0xb1);
  auVar47 = vminps_avx(auVar47,auVar3);
  auVar3 = vshufpd_avx(auVar47,auVar47,5);
  auVar47 = vminps_avx(auVar47,auVar3);
  auVar41 = vminps_avx(auVar47._0_16_,auVar47._16_16_);
  auVar4._4_4_ = fStack_10fc;
  auVar4._0_4_ = local_1100;
  auVar4._8_4_ = fStack_10f8;
  auVar4._12_4_ = fStack_10f4;
  auVar4._16_4_ = fStack_10f0;
  auVar4._20_4_ = fStack_10ec;
  auVar4._24_4_ = fStack_10e8;
  auVar4._28_4_ = fStack_10e4;
  auVar47 = vblendvps_avx(auVar81,auVar4,local_1120);
  auVar41 = vunpcklps_avx(auVar50,auVar41);
  auVar3 = vshufps_avx(auVar47,auVar47,0xb1);
  auVar47 = vminps_avx(auVar47,auVar3);
  auVar3 = vshufpd_avx(auVar47,auVar47,5);
  auVar47 = vminps_avx(auVar47,auVar3);
  auVar50 = vminps_avx(auVar47._0_16_,auVar47._16_16_);
  auVar73 = vinsertps_avx(auVar41,auVar50,0x28);
  auVar47 = vblendvps_avx(auVar83,auVar19,local_1120);
  auVar3 = vshufps_avx(auVar47,auVar47,0xb1);
  auVar47 = vmaxps_avx(auVar47,auVar3);
  auVar3 = vshufpd_avx(auVar47,auVar47,5);
  auVar47 = vmaxps_avx(auVar47,auVar3);
  auVar50 = vmaxps_avx(auVar47._0_16_,auVar47._16_16_);
  auVar47 = vblendvps_avx(auVar83,auVar18,local_1120);
  auVar3 = vshufps_avx(auVar47,auVar47,0xb1);
  auVar47 = vmaxps_avx(auVar47,auVar3);
  auVar3 = vshufpd_avx(auVar47,auVar47,5);
  auVar47 = vmaxps_avx(auVar47,auVar3);
  auVar41 = vmaxps_avx(auVar47._0_16_,auVar47._16_16_);
  auVar41 = vunpcklps_avx(auVar50,auVar41);
  auVar47 = vblendvps_avx(auVar83,auVar4,local_1120);
  auVar3 = vshufps_avx(auVar47,auVar47,0xb1);
  auVar47 = vmaxps_avx(auVar47,auVar3);
  auVar3 = vshufpd_avx(auVar47,auVar47,5);
  auVar47 = vmaxps_avx(auVar47,auVar3);
  auVar50 = vmaxps_avx(auVar47._0_16_,auVar47._16_16_);
  auVar77 = vinsertps_avx(auVar41,auVar50,0x28);
  local_fe0 = vblendvps_avx(auVar81,local_1000,local_1120);
  auVar47 = vshufps_avx(local_fe0,local_fe0,0xb1);
  auVar47 = vminps_avx(local_fe0,auVar47);
  auVar3 = vshufpd_avx(auVar47,auVar47,5);
  auVar3 = vminps_avx(auVar47,auVar3);
  auVar47 = vshufps_avx(local_1280,local_1280,0xb1);
  auVar47 = vmaxps_avx(local_1280,auVar47);
  auVar4 = vshufpd_avx(auVar47,auVar47,5);
  auVar47 = vmaxps_avx(auVar47,auVar4);
  auVar59 = vcmpps_avx(auVar73,_DAT_01f7aa10,5);
  auVar50 = vblendvps_avx(auVar77,auVar73,auVar59);
  auVar41 = vblendvps_avx(auVar58,auVar60,auVar59);
  auVar58 = vblendvps_avx(auVar60,auVar58,auVar59);
  auVar60 = vmovshdup_avx(auVar50);
  local_12a8 = (ulong)(auVar60._0_4_ < 0.0) << 4 | 0x20;
  auVar60 = vshufpd_avx(auVar50,auVar50,1);
  uVar37 = (ulong)(auVar60._0_4_ < 0.0) << 4 | 0x40;
  local_12b0 = local_12a8 ^ 0x10;
  local_12d8 = (vbool<8> *)(~local_fa0[1] & (ulong)pvVar28);
  auVar64 = vminps_avx(auVar3._0_16_,auVar3._16_16_);
  auVar59 = vblendvps_avx(auVar73,auVar77,auVar59);
  auVar60 = vmaxps_avx(auVar47._0_16_,auVar47._16_16_);
  auVar73._0_4_ = auVar41._0_4_ * auVar50._0_4_;
  auVar73._4_4_ = auVar41._4_4_ * auVar50._4_4_;
  auVar73._8_4_ = auVar41._8_4_ * auVar50._8_4_;
  auVar73._12_4_ = auVar41._12_4_ * auVar50._12_4_;
  auVar77._0_4_ = auVar58._0_4_ * auVar59._0_4_;
  auVar77._4_4_ = auVar58._4_4_ * auVar59._4_4_;
  auVar77._8_4_ = auVar58._8_4_ * auVar59._8_4_;
  auVar77._12_4_ = auVar58._12_4_ * auVar59._12_4_;
  uVar36 = (ulong)(auVar50._0_4_ < 0.0) << 4;
  uVar32 = uVar36 ^ 0x10;
  _local_1130 = vshufps_avx(auVar50,auVar50,0);
  local_1140 = vshufps_avx(auVar73,auVar73,0);
  _local_1150 = vshufps_avx(auVar50,auVar50,0x55);
  local_1160 = vshufps_avx(auVar73,auVar73,0x55);
  _local_1170 = vshufps_avx(auVar50,auVar50,0xaa);
  local_1300 = vblendvps_avx(auVar82,local_1020._16_16_,auVar51);
  local_1180 = vshufps_avx(auVar73,auVar73,0xaa);
  _local_1190 = vshufps_avx(auVar59,auVar59,0);
  _local_11a0 = vshufps_avx(auVar59,auVar59,0x55);
  _local_11b0 = vshufps_avx(auVar59,auVar59,0xaa);
  local_11c0 = vshufps_avx(auVar77,auVar77,0);
  local_11d0 = vshufps_avx(auVar77,auVar77,0x55);
  local_11e0 = vshufps_avx(auVar77,auVar77,0xaa);
  local_11f0 = vshufps_avx(auVar64,auVar64,0);
  local_1200 = vshufps_avx(auVar60,auVar60,0);
  auVar50 = vblendvps_avx(auVar82,local_1020._0_16_,auVar65);
  auVar44 = ZEXT1664(auVar50);
  puVar30 = local_fa0 + 2;
  local_12d0 = uVar36;
LAB_003bd06d:
  uVar27 = vmovmskps_avx(local_12a0);
  pvVar28 = (vbool<8> *)~CONCAT44((int)((ulong)pvVar28 >> 0x20),uVar27);
  while (puVar38 = puVar30 + -2, (puVar30[-1] & (ulong)pvVar28) != 0) {
    uVar35 = *puVar38;
    puVar30 = puVar38;
    uVar39 = uVar35;
    if ((uVar35 & 8) != 0) {
LAB_003bd344:
      local_1240._0_8_ = local_12a0._0_8_ ^ 0xffffffffffffffff;
      local_1240._8_4_ = local_12a0._8_4_ ^ 0xffffffff;
      local_1240._12_4_ = local_12a0._12_4_ ^ 0xffffffff;
      uStack_1230 = local_12a0._16_4_ ^ 0xffffffff;
      uStack_122c = local_12a0._20_4_ ^ 0xffffffff;
      uStack_1228 = local_12a0._24_4_ ^ 0xffffffff;
      uStack_1224 = local_12a0._28_4_ ^ 0xffffffff;
      pvVar28 = (vbool<8> *)((ulong)((uint)uVar35 & 0xf) - 8);
      auVar42 = local_12a0;
      if (pvVar28 == (vbool<8> *)0x0) goto LAB_003bd405;
      prim = (Primitive *)(uVar35 & 0xfffffffffffffff0);
      local_1300._0_8_ = (vbool<8> *)0x1;
      local_12b8 = pvVar28;
      goto LAB_003bd383;
    }
    while( true ) {
      pfVar1 = (float *)(uVar39 + 0x20 + uVar36);
      auVar50._0_4_ = (float)local_1130._0_4_ * *pfVar1;
      auVar50._4_4_ = (float)local_1130._4_4_ * pfVar1[1];
      auVar50._8_4_ = fStack_1128 * pfVar1[2];
      auVar50._12_4_ = fStack_1124 * pfVar1[3];
      auVar50 = vsubps_avx(auVar50,local_1140);
      pfVar1 = (float *)(uVar39 + 0x20 + local_12a8);
      auVar58._0_4_ = (float)local_1150._0_4_ * *pfVar1;
      auVar58._4_4_ = (float)local_1150._4_4_ * pfVar1[1];
      auVar58._8_4_ = fStack_1148 * pfVar1[2];
      auVar58._12_4_ = fStack_1144 * pfVar1[3];
      auVar41 = vsubps_avx(auVar58,local_1160);
      auVar50 = vpmaxsd_avx(auVar50,auVar41);
      pfVar1 = (float *)(uVar39 + 0x20 + uVar37);
      auVar59._0_4_ = (float)local_1170._0_4_ * *pfVar1;
      auVar59._4_4_ = (float)local_1170._4_4_ * pfVar1[1];
      auVar59._8_4_ = fStack_1168 * pfVar1[2];
      auVar59._12_4_ = fStack_1164 * pfVar1[3];
      auVar41 = vsubps_avx(auVar59,local_1180);
      auVar41 = vpmaxsd_avx(auVar41,local_11f0);
      auVar50 = vpmaxsd_avx(auVar50,auVar41);
      pfVar1 = (float *)(uVar39 + 0x20 + uVar32);
      auVar60._0_4_ = (float)local_1190._0_4_ * *pfVar1;
      auVar60._4_4_ = (float)local_1190._4_4_ * pfVar1[1];
      auVar60._8_4_ = fStack_1188 * pfVar1[2];
      auVar60._12_4_ = fStack_1184 * pfVar1[3];
      auVar41 = vsubps_avx(auVar60,local_11c0);
      pfVar1 = (float *)(uVar39 + 0x20 + local_12b0);
      auVar64._0_4_ = (float)local_11a0._0_4_ * *pfVar1;
      auVar64._4_4_ = (float)local_11a0._4_4_ * pfVar1[1];
      auVar64._8_4_ = fStack_1198 * pfVar1[2];
      auVar64._12_4_ = fStack_1194 * pfVar1[3];
      auVar58 = vsubps_avx(auVar64,local_11d0);
      auVar41 = vpminsd_avx(auVar41,auVar58);
      pfVar1 = (float *)(uVar39 + 0x20 + (uVar37 ^ 0x10));
      auVar65._0_4_ = (float)local_11b0._0_4_ * *pfVar1;
      auVar65._4_4_ = (float)local_11b0._4_4_ * pfVar1[1];
      auVar65._8_4_ = fStack_11a8 * pfVar1[2];
      auVar65._12_4_ = fStack_11a4 * pfVar1[3];
      auVar58 = vsubps_avx(auVar65,local_11e0);
      auVar58 = vpminsd_avx(auVar58,local_1200);
      auVar41 = vpminsd_avx(auVar41,auVar58);
      auVar50 = vcmpps_avx(auVar50,auVar41,2);
      uVar29 = vmovmskps_avx(auVar50);
      if (uVar29 == 0) break;
      uVar31 = (ulong)(uVar29 & 0xff);
      uVar33 = 0;
      uVar34 = 8;
      do {
        lVar2 = 0;
        if (uVar31 != 0) {
          for (; (uVar31 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        uVar27 = *(undefined4 *)(uVar39 + 0x20 + lVar2 * 4);
        auVar54._4_4_ = uVar27;
        auVar54._0_4_ = uVar27;
        auVar54._8_4_ = uVar27;
        auVar54._12_4_ = uVar27;
        auVar54._16_4_ = uVar27;
        auVar54._20_4_ = uVar27;
        auVar54._24_4_ = uVar27;
        auVar54._28_4_ = uVar27;
        auVar25._8_8_ = uStack_1058;
        auVar25._0_8_ = local_1060;
        auVar25._16_8_ = uStack_1050;
        auVar25._24_8_ = uStack_1048;
        auVar47 = vsubps_avx(auVar54,auVar25);
        auVar61._0_4_ = local_10c0 * auVar47._0_4_;
        auVar61._4_4_ = fStack_10bc * auVar47._4_4_;
        auVar61._8_4_ = fStack_10b8 * auVar47._8_4_;
        auVar61._12_4_ = fStack_10b4 * auVar47._12_4_;
        auVar62._16_4_ = fStack_10b0 * auVar47._16_4_;
        auVar62._0_16_ = auVar61;
        auVar62._20_4_ = fStack_10ac * auVar47._20_4_;
        auVar62._24_4_ = fStack_10a8 * auVar47._24_4_;
        uVar27 = *(undefined4 *)(uVar39 + 0x40 + lVar2 * 4);
        auVar55._4_4_ = uVar27;
        auVar55._0_4_ = uVar27;
        auVar55._8_4_ = uVar27;
        auVar55._12_4_ = uVar27;
        auVar55._16_4_ = uVar27;
        auVar55._20_4_ = uVar27;
        auVar55._24_4_ = uVar27;
        auVar55._28_4_ = uVar27;
        auVar23._8_8_ = uStack_1078;
        auVar23._0_8_ = local_1080;
        auVar23._16_8_ = uStack_1070;
        auVar23._24_8_ = uStack_1068;
        auVar47 = vsubps_avx(auVar55,auVar23);
        auVar66._0_4_ = local_10e0 * auVar47._0_4_;
        auVar66._4_4_ = fStack_10dc * auVar47._4_4_;
        auVar66._8_4_ = fStack_10d8 * auVar47._8_4_;
        auVar66._12_4_ = fStack_10d4 * auVar47._12_4_;
        auVar67._16_4_ = fStack_10d0 * auVar47._16_4_;
        auVar67._0_16_ = auVar66;
        auVar67._20_4_ = fStack_10cc * auVar47._20_4_;
        auVar67._24_4_ = fStack_10c8 * auVar47._24_4_;
        uVar27 = *(undefined4 *)(uVar39 + 0x60 + lVar2 * 4);
        auVar56._4_4_ = uVar27;
        auVar56._0_4_ = uVar27;
        auVar56._8_4_ = uVar27;
        auVar56._12_4_ = uVar27;
        auVar56._16_4_ = uVar27;
        auVar56._20_4_ = uVar27;
        auVar56._24_4_ = uVar27;
        auVar56._28_4_ = uVar27;
        auVar21._8_8_ = uStack_1098;
        auVar21._0_8_ = local_10a0;
        auVar21._16_8_ = uStack_1090;
        auVar21._24_8_ = uStack_1088;
        auVar47 = vsubps_avx(auVar56,auVar21);
        auVar51._0_4_ = local_1100 * auVar47._0_4_;
        auVar51._4_4_ = fStack_10fc * auVar47._4_4_;
        auVar51._8_4_ = fStack_10f8 * auVar47._8_4_;
        auVar51._12_4_ = fStack_10f4 * auVar47._12_4_;
        auVar3._16_4_ = fStack_10f0 * auVar47._16_4_;
        auVar3._0_16_ = auVar51;
        auVar3._20_4_ = fStack_10ec * auVar47._20_4_;
        auVar3._24_4_ = fStack_10e8 * auVar47._24_4_;
        auVar3._28_4_ = auVar47._28_4_;
        uVar27 = *(undefined4 *)(uVar39 + 0x30 + lVar2 * 4);
        auVar72._4_4_ = uVar27;
        auVar72._0_4_ = uVar27;
        auVar72._8_4_ = uVar27;
        auVar72._12_4_ = uVar27;
        auVar72._16_4_ = uVar27;
        auVar72._20_4_ = uVar27;
        auVar72._24_4_ = uVar27;
        auVar72._28_4_ = uVar27;
        auVar47 = vsubps_avx(auVar72,auVar25);
        auVar69._0_4_ = local_10c0 * auVar47._0_4_;
        auVar69._4_4_ = fStack_10bc * auVar47._4_4_;
        auVar69._8_4_ = fStack_10b8 * auVar47._8_4_;
        auVar69._12_4_ = fStack_10b4 * auVar47._12_4_;
        auVar15._16_4_ = fStack_10b0 * auVar47._16_4_;
        auVar15._0_16_ = auVar69;
        auVar15._20_4_ = fStack_10ac * auVar47._20_4_;
        auVar15._24_4_ = fStack_10a8 * auVar47._24_4_;
        auVar15._28_4_ = auVar47._28_4_;
        uVar27 = *(undefined4 *)(uVar39 + 0x50 + lVar2 * 4);
        auVar76._4_4_ = uVar27;
        auVar76._0_4_ = uVar27;
        auVar76._8_4_ = uVar27;
        auVar76._12_4_ = uVar27;
        auVar76._16_4_ = uVar27;
        auVar76._20_4_ = uVar27;
        auVar76._24_4_ = uVar27;
        auVar76._28_4_ = uVar27;
        auVar47 = vsubps_avx(auVar76,auVar23);
        auVar74._0_4_ = local_10e0 * auVar47._0_4_;
        auVar74._4_4_ = fStack_10dc * auVar47._4_4_;
        auVar74._8_4_ = fStack_10d8 * auVar47._8_4_;
        auVar74._12_4_ = fStack_10d4 * auVar47._12_4_;
        auVar16._16_4_ = fStack_10d0 * auVar47._16_4_;
        auVar16._0_16_ = auVar74;
        auVar16._20_4_ = fStack_10cc * auVar47._20_4_;
        auVar16._24_4_ = fStack_10c8 * auVar47._24_4_;
        auVar16._28_4_ = auVar47._28_4_;
        uVar27 = *(undefined4 *)(uVar39 + 0x70 + lVar2 * 4);
        auVar79._4_4_ = uVar27;
        auVar79._0_4_ = uVar27;
        auVar79._8_4_ = uVar27;
        auVar79._12_4_ = uVar27;
        auVar79._16_4_ = uVar27;
        auVar79._20_4_ = uVar27;
        auVar79._24_4_ = uVar27;
        auVar79._28_4_ = uVar27;
        auVar47 = vsubps_avx(auVar79,auVar21);
        auVar78._0_4_ = local_1100 * auVar47._0_4_;
        auVar78._4_4_ = fStack_10fc * auVar47._4_4_;
        auVar78._8_4_ = fStack_10f8 * auVar47._8_4_;
        auVar78._12_4_ = fStack_10f4 * auVar47._12_4_;
        auVar17._16_4_ = fStack_10f0 * auVar47._16_4_;
        auVar17._0_16_ = auVar78;
        auVar17._20_4_ = fStack_10ec * auVar47._20_4_;
        auVar17._24_4_ = fStack_10e8 * auVar47._24_4_;
        auVar17._28_4_ = auVar47._28_4_;
        auVar63._12_4_ = 0;
        auVar63._0_12_ = auVar62._16_12_;
        auVar50 = vpmaxsd_avx(auVar63,auVar15._16_16_);
        auVar41 = vpmaxsd_avx(auVar61,auVar69);
        auVar68._12_4_ = 0;
        auVar68._0_12_ = auVar67._16_12_;
        auVar58 = vpmaxsd_avx(auVar68,auVar16._16_16_);
        auVar58 = vpminsd_avx(auVar50,auVar58);
        auVar50 = vpmaxsd_avx(auVar66,auVar74);
        auVar41 = vpminsd_avx(auVar41,auVar50);
        auVar50 = vpmaxsd_avx(auVar51,auVar78);
        auVar50 = vpminsd_avx(auVar50,auVar44._0_16_);
        auVar59 = vpminsd_avx(auVar41,auVar50);
        auVar50 = vpmaxsd_avx(auVar3._16_16_,auVar17._16_16_);
        auVar50 = vpminsd_avx(auVar50,local_1300);
        auVar60 = vpminsd_avx(auVar58,auVar50);
        auVar50 = vpminsd_avx(auVar61,auVar69);
        auVar41 = vpminsd_avx(auVar63,auVar15._16_16_);
        auVar58 = vpminsd_avx(auVar66,auVar74);
        auVar50 = vpmaxsd_avx(auVar50,auVar58);
        auVar58 = vpminsd_avx(auVar68,auVar16._16_16_);
        auVar41 = vpmaxsd_avx(auVar41,auVar58);
        auVar58 = vpminsd_avx(auVar3._16_16_,auVar17._16_16_);
        auVar73 = vpminsd_avx(auVar51,auVar78);
        auVar58 = vpmaxsd_avx(auVar58,local_fe0._16_16_);
        auVar41 = vpmaxsd_avx(auVar41,auVar58);
        auVar58 = vpmaxsd_avx(auVar73,local_fe0._0_16_);
        auVar50 = vpmaxsd_avx(auVar50,auVar58);
        auVar57._16_16_ = auVar41;
        auVar57._0_16_ = auVar50;
        auVar47._16_16_ = auVar60;
        auVar47._0_16_ = auVar59;
        auVar47 = vcmpps_avx(auVar57,auVar47,2);
        uVar35 = uVar34;
        if ((((((((auVar47 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar47 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar47 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar47 >> 0x7f,0) != '\0') ||
              (auVar47 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar47 >> 0xbf,0) != '\0') ||
            (auVar47 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar47[0x1f] < '\0') {
          uVar35 = *(ulong *)(uVar39 + lVar2 * 8);
          if (uVar34 != 8) {
            *puVar30 = uVar34;
            puVar30[1] = uVar33;
            puVar30 = puVar30 + 2;
          }
          uVar29 = vmovmskps_avx(auVar47);
          uVar33 = (ulong)uVar29;
        }
        uVar31 = uVar31 & uVar31 - 1;
        uVar34 = uVar35;
      } while (uVar31 != 0);
      if (uVar35 == 8) break;
      uVar39 = uVar35;
      if ((uVar35 & 8) != 0) {
        auVar44 = ZEXT3264(local_1280);
        puVar38 = puVar30;
        if (uVar33 == 0) goto LAB_003bd450;
        goto LAB_003bd344;
      }
    }
    if (puVar30 == local_fa0) goto LAB_003bd477;
  }
  auVar44 = ZEXT3264(local_1280);
  goto LAB_003bd450;
  while( true ) {
    prim = prim + 1;
    pvVar28 = (vbool<8> *)
              ((long)(anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 *)local_1300._0_8_ + 1);
    bVar40 = local_12b8 <= (ulong)local_1300._0_8_;
    local_1300._0_8_ = pvVar28;
    if (bVar40) break;
LAB_003bd383:
    pvVar28 = InstanceIntersectorK<8>::occluded
                        ((vbool<8> *)&local_fc0.field_1,(vbool<8> *)local_1240,&local_1301,ray,
                         local_12c0,prim);
    aVar26 = _local_1240;
    aiVar5 = (int  [8])vandnps_avx(local_fc0.i,_local_1240);
    local_1240._0_4_ = aiVar5[0];
    local_1240._4_4_ = aiVar5[1];
    local_1240._8_4_ = aiVar5[2];
    local_1240._12_4_ = aiVar5[3];
    uStack_1230 = aiVar5[4];
    uStack_122c = aiVar5[5];
    uStack_1228 = aiVar5[6];
    uStack_1224 = aiVar5[7];
    auVar47 = (undefined1  [32])aVar26 & ~(undefined1  [32])local_fc0;
    ray = local_12c8;
    if ((((((((auVar47 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar47 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar47 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar47 >> 0x7f,0) == '\0') &&
          (auVar47 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar47 >> 0xbf,0) == '\0') &&
        (auVar47 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar47[0x1f])
    break;
  }
  auVar42._0_8_ = aiVar5._0_8_ ^ 0xffffffffffffffff;
  auVar42._8_4_ = aiVar5[2] ^ 0xffffffff;
  auVar42._12_4_ = aiVar5[3] ^ 0xffffffff;
  auVar42._16_4_ = aiVar5[4] ^ 0xffffffff;
  auVar42._20_4_ = aiVar5[5] ^ 0xffffffff;
  auVar42._24_4_ = aiVar5[6] ^ 0xffffffff;
  auVar42._28_4_ = aiVar5[7] ^ 0xffffffff;
  uVar36 = local_12d0;
LAB_003bd405:
  local_12a0 = vorps_avx(local_12a0,auVar42);
  auVar47 = local_1120 & ~local_12a0;
  if ((((((((auVar47 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar47 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar47 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar47 >> 0x7f,0) == '\0') &&
        (auVar47 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar47 >> 0xbf,0) == '\0') &&
      (auVar47 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar47[0x1f])
  goto LAB_003bd477;
  local_1120 = vandnps_avx(local_12a0,local_1120);
  auVar48._8_4_ = 0xff800000;
  auVar48._0_8_ = 0xff800000ff800000;
  auVar48._12_4_ = 0xff800000;
  auVar48._16_4_ = 0xff800000;
  auVar48._20_4_ = 0xff800000;
  auVar48._24_4_ = 0xff800000;
  auVar48._28_4_ = 0xff800000;
  auVar47 = vblendvps_avx(local_1280,auVar48,local_12a0);
  auVar44 = ZEXT3264(auVar47);
LAB_003bd450:
  local_1300 = auVar44._16_16_;
  local_1280 = auVar44._0_32_;
  puVar30 = puVar38;
  if (puVar38 == local_fa0) goto LAB_003bd477;
  goto LAB_003bd06d;
LAB_003bd477:
  pvVar28 = local_12d8;
  if (local_12d8 == (vbool<8> *)0x0) {
    auVar43._0_16_ = local_1040._0_16_;
    auVar43._16_16_ = local_1210;
    auVar47 = vandps_avx(auVar43,local_12a0);
    auVar49._8_4_ = 0xff800000;
    auVar49._0_8_ = 0xff800000ff800000;
    auVar49._12_4_ = 0xff800000;
    auVar49._16_4_ = 0xff800000;
    auVar49._20_4_ = 0xff800000;
    auVar49._24_4_ = 0xff800000;
    auVar49._28_4_ = 0xff800000;
    auVar47 = vmaskmovps_avx(auVar47,auVar49);
    *(undefined1 (*) [32])local_12e8 = auVar47;
    return;
  }
  goto LAB_003bcc1f;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occludedCoherent(vint<K>* __restrict__ valid_i,
                                                                                                      Accel::Intersectors* __restrict__ This,
                                                                                                      RayK<K>& __restrict__ ray,
                                                                                                      RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid,ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      vbool<K> terminated = !valid;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      do
      {
        const size_t valid_index = bsf(valid_bits);
        vbool<K> octant_valid = octant[valid_index] == octant;
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar,  vfloat<K>(neg_inf));

        Frustum<robust> frustum;
        frustum.template init<K>(octant_valid, tray.org, tray.rdir, tray.tnear, tray.tfar, N);

        StackItemMaskT<NodeRef> stack[stackSizeSingle];  // stack of nodes
        StackItemMaskT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
        stack[0].ptr  = bvh->root;
        stack[0].mask = movemask(octant_valid);

        while (1) pop:
        {
          /* pop next node from stack */
          if (unlikely(stackPtr == stack)) break;

          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* cull node of active rays have already been terminated */
          size_t m_active = (size_t)stackPtr->mask & (~(size_t)movemask(terminated));

          if (unlikely(m_active == 0)) continue;

          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            //STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const AABBNode* __restrict__ const node = nodeRef.getAABBNode();

            vfloat<N> fmin;
            size_t m_frustum_node = intersectNodeFrustum<N>(node, frustum, fmin);

            if (unlikely(!m_frustum_node)) goto pop;
            cur = BVH::emptyNode;
            m_active = 0;

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[popcnt(m_frustum_node)], 1, 1, 1);
#endif
            //size_t num_child_hits = 0;
            do {
              const size_t i = bscf(m_frustum_node);
              vfloat<K> lnearP;
              vbool<K> lhit = false; // motion blur is not supported, so the initial value will be ignored
              STAT3(normal.trav_nodes, 1, 1, 1);
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              if (likely(any(lhit)))
              {                                
                const NodeRef child = node->child(i);
                assert(child != BVH::emptyNode);
                BVHN<N>::prefetch(child);
                if (likely(cur != BVH::emptyNode)) {
                  //num_child_hits++;
                  stackPtr->ptr  = cur;
                  stackPtr->mask = m_active;
                  stackPtr++;
                }
                cur = child;
                m_active = movemask(lhit);
              }
            } while(m_frustum_node);

            if (unlikely(cur == BVH::emptyNode)) goto pop;
          }

          /* intersect leaf */
          assert(cur != BVH::invalidNode);
          assert(cur != BVH::emptyNode);
#if defined(__AVX__)
          STAT3(normal.trav_leaves, 1, popcnt(m_active), K);
#endif
          if (unlikely(!m_active)) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
          octant_valid &= !terminated;
          if (unlikely(none(octant_valid))) break;
          tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

          if (unlikely(lazy_node)) {
            stackPtr->ptr  = lazy_node;
            stackPtr->mask = movemask(octant_valid);
            stackPtr++;
          }
        }
      } while(valid_bits);

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }